

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

int __thiscall Cleaner::CleanDead(Cleaner *this,Entries *entries)

{
  State *this_00;
  bool bVar1;
  pointer pvVar2;
  Edge *pEVar3;
  string local_60;
  char *local_40;
  size_t local_38;
  Node *local_30;
  Node *n;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> local_20;
  const_iterator i;
  Entries *entries_local;
  Cleaner *this_local;
  
  i.super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>)
       (_Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>)entries;
  Reset(this);
  PrintHeader(this);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
       ::begin(i.super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
               ._M_cur);
  do {
    n = (Node *)std::
                unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
                ::end((unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
                       *)i.
                         super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                         ._M_cur);
    bVar1 = std::__detail::operator!=
                      (&local_20,
                       (_Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                        *)&n);
    if (!bVar1) {
      PrintFooter(this);
      return this->status_;
    }
    this_00 = this->state_;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                         *)&local_20);
    local_40 = (pvVar2->first).str_;
    local_38 = (pvVar2->first).len_;
    local_30 = State::LookupNode(this_00,pvVar2->first);
    if (local_30 == (Node *)0x0) {
LAB_0011df97:
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                             *)&local_20);
      StringPiece::AsString_abi_cxx11_(&local_60,&pvVar2->first);
      Remove(this,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      pEVar3 = Node::in_edge(local_30);
      if (pEVar3 == (Edge *)0x0) goto LAB_0011df97;
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>::
    operator++((_Node_const_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                *)&local_20);
  } while( true );
}

Assistant:

int Cleaner::CleanDead(const BuildLog::Entries& entries) {
  Reset();
  PrintHeader();
  for (BuildLog::Entries::const_iterator i = entries.begin(); i != entries.end(); ++i) {
    Node* n = state_->LookupNode(i->first);
    if (!n || !n->in_edge()) {
      Remove(i->first.AsString());
    }
  }
  PrintFooter();
  return status_;
}